

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

bool bech32::anon_unknown_0::CheckCharacters(string *str,vector<int,_std::allocator<int>_> *errors)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  byte *pbVar6;
  long in_FS_OFFSET;
  uchar c;
  size_t i;
  bool upper;
  bool lower;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  bVar4 = false;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while (this = local_38,
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(in_stack_ffffffffffffffa8), this < pbVar5) {
    pbVar6 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[](this,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                                 );
    bVar1 = *pbVar6;
    if ((bVar1 < 0x61) || (0x7a < bVar1)) {
      if ((bVar1 < 0x41) || (0x5a < bVar1)) {
        if ((bVar1 < 0x21) || (0x7e < bVar1)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8,
                     (value_type_conflict2 *)0x18e987d);
        }
      }
      else if (bVar3) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8,
                   (value_type_conflict2 *)0x18e9848);
      }
      else {
        bVar4 = true;
      }
    }
    else if (bVar4) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8,
                 (value_type_conflict2 *)0x18e980c);
    }
    else {
      bVar3 = true;
    }
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(local_38->_M_dataplus)._M_p + 1);
  }
  bVar4 = std::vector<int,_std::allocator<int>_>::empty((vector<int,_std::allocator<int>_> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CheckCharacters(const std::string& str, std::vector<int>& errors)
{
    bool lower = false, upper = false;
    for (size_t i = 0; i < str.size(); ++i) {
        unsigned char c{(unsigned char)(str[i])};
        if (c >= 'a' && c <= 'z') {
            if (upper) {
                errors.push_back(i);
            } else {
                lower = true;
            }
        } else if (c >= 'A' && c <= 'Z') {
            if (lower) {
                errors.push_back(i);
            } else {
                upper = true;
            }
        } else if (c < 33 || c > 126) {
            errors.push_back(i);
        }
    }
    return errors.empty();
}